

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

void __thiscall
pbrt::CameraHandle::ApproximatedPdxy(CameraHandle *this,SurfaceInteraction *si,int samplesPerPixel)

{
  CameraBase::ApproximatedPdxy
            ((CameraBase *)
             ((this->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits & 0xffffffffffff),si,samplesPerPixel);
  return;
}

Assistant:

PBRT_CPU_GPU inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        // Recursively consider half of the candidate types depending on _tag_
        constexpr int mid = n / 2;
        if (tag - 1 < mid)
            return DispatchSplit<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplit<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }